

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O0

bool __thiscall
crnlib::dxt1_endpoint_optimizer::compute(dxt1_endpoint_optimizer *this,params *p,results *r)

{
  results *r_local;
  params *p_local;
  dxt1_endpoint_optimizer *this_local;
  
  if (p->m_pPixels == (color_quad_u8 *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    compute_internal(this,p,r);
    if ((((this->m_pParams->m_use_alpha_blocks & 1U) == 0) ||
        ((this->m_pParams->m_use_transparent_indices_for_black & 1U) == 0)) ||
       ((this->m_pParams->m_pixels_have_alpha & 1U) != 0)) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = try_alpha_as_black_optimization(this);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool dxt1_endpoint_optimizer::compute(const params& p, results& r)
    {
        if (!p.m_pPixels)
        {
            return false;
        }
        compute_internal(p, r);
        if (m_pParams->m_use_alpha_blocks && m_pParams->m_use_transparent_indices_for_black && !m_pParams->m_pixels_have_alpha)
        {
            return try_alpha_as_black_optimization();
        }
        return true;
    }